

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void satoko_assump_push(solver_t *s,int lit)

{
  vec_uint_t *pvVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)lit >> 1;
  if (s->assigns->size <= uVar5) {
    __assert_fail("lit2var(lit) < (unsigned)satoko_varnum(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                  ,300,"void satoko_assump_push(solver_t *, int)");
  }
  pvVar1 = s->assumptions;
  uVar3 = pvVar1->size;
  uVar4 = (ulong)uVar3;
  if (uVar3 == pvVar1->cap) {
    if (uVar3 < 0x10) {
      puVar2 = (uint *)realloc(pvVar1->data,0x40);
      pvVar1->data = puVar2;
      uVar3 = 0x10;
      if (puVar2 == (uint *)0x0) {
LAB_00558dcb:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar3 < 1) goto LAB_00558d5e;
      puVar2 = (uint *)realloc(pvVar1->data,uVar4 * 8);
      pvVar1->data = puVar2;
      if (puVar2 == (uint *)0x0) goto LAB_00558dcb;
      uVar3 = uVar3 * 2;
    }
    pvVar1->cap = uVar3;
    uVar4 = (ulong)pvVar1->size;
  }
LAB_00558d5e:
  pvVar1->data[uVar4] = lit;
  pvVar1->size = pvVar1->size + 1;
  if (s->polarity->size <= uVar5) {
    __assert_fail("(idx >= 0) && (idx < vec_char_size(p))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_char.h"
                  ,0xb9,"void vec_char_assign(vec_char_t *, unsigned int, char)");
  }
  s->polarity->data[uVar5] = (byte)lit & 1;
  return;
}

Assistant:

void satoko_assump_push(solver_t *s, int lit)
{
    assert(lit2var(lit) < (unsigned)satoko_varnum(s));
    // printf("[Satoko] Push assumption: %d\n", lit);
    vec_uint_push_back(s->assumptions, lit);
    vec_char_assign(s->polarity, lit2var(lit), lit_polarity(lit));
}